

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

int32_t container_size_in_bytes(container_t *c,uint8_t typecode)

{
  uint8_t in_SIL;
  container_t *in_RDI;
  uint8_t local_11;
  array_container_t *local_10;
  int32_t local_4;
  
  local_11 = in_SIL;
  local_10 = (array_container_t *)container_unwrap_shared(in_RDI,&local_11);
  if (local_11 == '\x01') {
    local_4 = bitset_container_size_in_bytes((bitset_container_t *)local_10);
  }
  else if (local_11 == '\x02') {
    local_4 = array_container_size_in_bytes(local_10);
  }
  else {
    local_4 = run_container_size_in_bytes((run_container_t *)0x172549);
  }
  return local_4;
}

Assistant:

static inline int32_t container_size_in_bytes(const container_t *c,
                                              uint8_t typecode) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_size_in_bytes(const_CAST_bitset(c));
        case ARRAY_CONTAINER_TYPE:
            return array_container_size_in_bytes(const_CAST_array(c));
        case RUN_CONTAINER_TYPE:
            return run_container_size_in_bytes(const_CAST_run(c));
    }
    assert(false);
    roaring_unreachable;
    return 0;  // unreached
}